

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

BrotliDecoderErrorCode
ReadHuffmanCode(uint32_t alphabet_size_max,uint32_t alphabet_size_limit,HuffmanCode *table,
               uint32_t *opt_table_size,BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br_00;
  uint32_t *puVar1;
  uint8_t *code_lengths;
  short *psVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  ushort uVar6;
  byte *pbVar7;
  uint16_t *puVar8;
  uint *puVar9;
  BrotliDecoderErrorCode BVar10;
  BrotliDecoderErrorCode BVar11;
  int iVar12;
  sbyte sVar13;
  BrotliRunningHuffmanState BVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  long lVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  ulong uVar21;
  char cVar22;
  bool bVar23;
  uint uVar24;
  uint32_t uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  byte *in_R9;
  size_t sVar32;
  int iVar33;
  uint32_t uVar34;
  ulong unaff_R15;
  uint64_t uVar35;
  bool bVar36;
  BrotliBitReader *br;
  
  br_00 = &s->br;
  code_lengths = (s->arena).header.code_length_code_lengths;
  BVar14 = (s->arena).header.substate_huffman;
  while (BVar14 == BROTLI_STATE_HUFFMAN_NONE) {
    uVar15 = (s->br).bit_pos_;
    bVar36 = uVar15 - 0x3f < 2;
    if (bVar36) {
      sVar32 = (s->br).avail_in;
      if (sVar32 != 0) {
        uVar27 = (s->br).val_;
        pbVar7 = (s->br).next_in;
        (s->br).val_ = uVar27 >> 8;
        (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar27 >> 8;
        uVar15 = uVar15 - 8;
        (s->br).bit_pos_ = uVar15;
        (s->br).avail_in = sVar32 - 1;
        in_R9 = pbVar7 + 1;
        (s->br).next_in = in_R9;
        bVar36 = false;
        goto LAB_001031c8;
      }
    }
    else {
LAB_001031c8:
      (s->arena).header.sub_loop_counter = (uint)((s->br).val_ >> ((byte)uVar15 & 0x3f)) & 3;
      (s->br).bit_pos_ = uVar15 + 2;
    }
    if (bVar36) {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if ((s->arena).header.sub_loop_counter == 1) goto switchD_0010322c_caseD_1;
    *(undefined8 *)((long)&s->arena + 0x1c) = 0x2000000000;
    *(undefined8 *)((long)&s->arena + 0x6de) = 0;
    *(undefined8 *)((long)&s->arena + 0x6e6) = 0;
    code_lengths[0] = '\0';
    code_lengths[1] = '\0';
    code_lengths[2] = '\0';
    code_lengths[3] = '\0';
    code_lengths[4] = '\0';
    code_lengths[5] = '\0';
    code_lengths[6] = '\0';
    code_lengths[7] = '\0';
    *(undefined8 *)((long)&s->arena + 0x6d8) = 0;
    (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
    BVar14 = BROTLI_STATE_HUFFMAN_COMPLEX;
  }
  BVar11 = 0x10815c;
  switch(BVar14) {
  case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
switchD_0010322c_caseD_1:
    uVar15 = (s->br).bit_pos_;
    uVar26 = uVar15 - 0x3f;
    BVar11 = CONCAT31((int3)(uVar26 >> 8),uVar26 < 2);
    if (uVar26 < 2) {
      sVar32 = (s->br).avail_in;
      if (sVar32 != 0) {
        uVar27 = (s->br).val_;
        pbVar7 = (s->br).next_in;
        (s->br).val_ = uVar27 >> 8;
        (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar27 >> 8;
        uVar15 = uVar15 - 8;
        (s->br).bit_pos_ = uVar15;
        (s->br).avail_in = sVar32 - 1;
        (s->br).next_in = pbVar7 + 1;
        BVar11 = BROTLI_DECODER_NO_ERROR;
        goto LAB_0010327b;
      }
    }
    else {
LAB_0010327b:
      (s->arena).header.symbol = (uint)((s->br).val_ >> ((byte)uVar15 & 0x3f)) & 3;
      (s->br).bit_pos_ = uVar15 + 2;
    }
    if ((char)BVar11 != '\0') {
      BVar11 = BROTLI_DECODER_NEEDS_MORE_INPUT;
      BVar14 = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
      goto LAB_00103656;
    }
    (s->arena).header.sub_loop_counter = 0;
  case BROTLI_STATE_HUFFMAN_SIMPLE_READ:
    uVar29 = alphabet_size_max - 1;
    uVar26 = 0x1f;
    if (uVar29 != 0) {
      for (; uVar29 >> uVar26 == 0; uVar26 = uVar26 - 1) {
      }
    }
    uVar26 = (uVar26 ^ 0xffffffe0) + 0x21;
    if (uVar29 == 0) {
      uVar26 = 0;
    }
    uVar27 = (ulong)(s->arena).header.sub_loop_counter;
    uVar29 = (s->arena).header.symbol;
    do {
      uVar30 = (uint)uVar27;
      if (uVar29 < uVar30) {
        uVar26 = 2;
        uVar27 = 0;
        goto LAB_00103525;
      }
      uVar15 = (s->br).bit_pos_;
      bVar36 = 0x40 - uVar15 < uVar26;
      if (bVar36) {
        sVar32 = (s->br).avail_in;
        if (sVar32 == 0) {
          bVar36 = true;
        }
        else {
          uVar35 = (s->br).val_;
          uVar24 = 0x48 - uVar15;
          pbVar7 = (s->br).next_in;
          do {
            uVar15 = uVar15 - 8;
            sVar32 = sVar32 - 1;
            (s->br).val_ = uVar35 >> 8;
            uVar35 = (ulong)*pbVar7 << 0x38 | uVar35 >> 8;
            (s->br).val_ = uVar35;
            (s->br).bit_pos_ = uVar15;
            (s->br).avail_in = sVar32;
            (s->br).next_in = pbVar7 + 1;
            bVar36 = uVar24 < uVar26;
            if (!bVar36) goto LAB_001034c1;
            uVar24 = uVar24 + 8;
            pbVar7 = pbVar7 + 1;
          } while (sVar32 != 0);
        }
      }
      else {
LAB_001034c1:
        in_R9 = (byte *)(ulong)((uint)((s->br).val_ >> ((byte)uVar15 & 0x3f)) & kBitMask[uVar26]);
        (s->br).bit_pos_ = uVar15 + uVar26;
      }
      if (bVar36) {
        (s->arena).header.sub_loop_counter = uVar30;
        (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
        BVar11 = BROTLI_DECODER_NEEDS_MORE_INPUT;
LAB_001034f6:
        bVar36 = false;
      }
      else {
        if (alphabet_size_limit <= (uint)in_R9) {
          BVar11 = BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET;
          goto LAB_001034f6;
        }
        *(short *)((long)&s->arena + uVar27 * 2 + 0xb0) = (short)in_R9;
        uVar27 = (ulong)(uVar30 + 1);
        bVar36 = true;
      }
    } while (bVar36);
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD:
    goto LAB_00103592;
  case BROTLI_STATE_HUFFMAN_COMPLEX:
    uVar27 = (ulong)(s->arena).header.sub_loop_counter;
    uVar15 = (s->arena).header.repeat;
    uVar25 = (s->arena).header.space;
    if (uVar27 < 0x12) {
      uVar34 = (s->br).bit_pos_;
      do {
        bVar3 = "\x01\x02\x03\x04"[uVar27];
        bVar36 = uVar34 - 0x3d < 4;
        if (bVar36) {
          sVar32 = (s->br).avail_in;
          if (sVar32 != 0) {
            uVar28 = (s->br).val_;
            pbVar7 = (s->br).next_in;
            (s->br).val_ = uVar28 >> 8;
            (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar28 >> 8;
            uVar34 = uVar34 - 8;
            (s->br).bit_pos_ = uVar34;
            (s->br).avail_in = sVar32 - 1;
            (s->br).next_in = pbVar7 + 1;
            bVar36 = false;
            goto LAB_0010333d;
          }
          bVar36 = true;
        }
        else {
LAB_0010333d:
          unaff_R15 = (ulong)((uint)(br_00->val_ >> ((byte)uVar34 & 0x3f)) & 0xf);
        }
        if (bVar36) {
          unaff_R15 = 0;
          if (uVar34 - 0x40 != 0) {
            unaff_R15 = (ulong)((uint)(br_00->val_ >> ((byte)uVar34 & 0x3f)) & 0xf);
          }
          if ((uint)"\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[unaff_R15] <=
              -(uVar34 - 0x40)) goto LAB_00103353;
          (s->arena).header.sub_loop_counter = (uint32_t)uVar27;
          (s->arena).header.repeat = uVar15;
          (s->arena).header.space = uVar25;
          (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
          cVar22 = '\x01';
        }
        else {
LAB_00103353:
          bVar4 = ""[unaff_R15 & 0xffffffff];
          uVar34 = uVar34 + "\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"
                            [unaff_R15 & 0xffffffff];
          (s->br).bit_pos_ = uVar34;
          *(byte *)((long)&s->arena + (ulong)bVar3 + 0x6d0) = bVar4;
          cVar22 = '\0';
          if ((0x1111UL >> (unaff_R15 & 0x3f) & 1) == 0) {
            uVar25 = uVar25 - (0x20U >> (bVar4 & 0x1f));
            uVar15 = uVar15 + 1;
            psVar2 = (short *)((long)&s->arena + (ulong)bVar4 * 2 + 0x6e2);
            *psVar2 = *psVar2 + 1;
            cVar22 = (uVar25 - 0x21 < 0xffffffe0) * '\x02';
          }
        }
        if (cVar22 != '\0') {
          if (cVar22 != '\x02') {
            BVar11 = BROTLI_DECODER_NEEDS_MORE_INPUT;
            goto LAB_0010367f;
          }
          break;
        }
        uVar27 = uVar27 + 1;
      } while ((int)uVar27 != 0x12);
    }
    BVar11 = BROTLI_DECODER_ERROR_FORMAT_CL_SPACE;
    if (uVar25 == 0) {
      BVar11 = BROTLI_DECODER_SUCCESS;
    }
    if (uVar15 == 1) {
      BVar11 = BROTLI_DECODER_SUCCESS;
    }
LAB_0010367f:
    if (BVar11 != BROTLI_DECODER_SUCCESS) {
      return BVar11;
    }
    BrotliBuildCodeLengthsHuffmanTable
              ((s->arena).header.table,code_lengths,(s->arena).header.code_length_histo);
    *(undefined8 *)((long)&s->arena + 0x6f2) = 0;
    *(undefined8 *)((long)&s->arena + 0x6fa) = 0;
    *(undefined8 *)((long)&s->arena + 0x6e2) = 0;
    *(undefined8 *)((long)&s->arena + 0x6ea) = 0;
    puVar8 = (s->arena).header.symbol_lists;
    lVar17 = 0;
    do {
      *(int *)((long)&s->arena + lVar17 * 4 + 0x650) = (int)lVar17 + -0x10;
      puVar8[lVar17 + -0x10] = 0xffff;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x10);
    *(undefined8 *)((long)&s->arena + 0x10) = 0x800000000;
    *(undefined8 *)((long)&s->arena + 0x18) = 0;
    (s->arena).header.space = 0x8000;
    (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
  case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS:
    uVar15 = (s->arena).header.symbol;
    uVar25 = (s->arena).header.repeat;
    uVar34 = (s->arena).header.space;
    uVar20 = (s->arena).header.repeat_code_len;
    uVar18 = (s->arena).header.prev_code_len;
    puVar8 = (s->arena).header.symbol_lists;
    iVar12 = BrotliWarmupBitReader(br_00);
    BVar11 = BROTLI_DECODER_NEEDS_MORE_INPUT;
    bVar36 = true;
    if (iVar12 != 0) {
      do {
        if ((alphabet_size_limit <= uVar15) || (uVar34 == 0)) {
          (s->arena).header.space = uVar34;
          BVar11 = BROTLI_DECODER_SUCCESS;
          bVar36 = false;
          goto LAB_00103919;
        }
        uVar27 = (s->br).avail_in;
        if (uVar27 < 4) {
          (s->arena).header.symbol = uVar15;
          (s->arena).header.repeat = uVar25;
          (s->arena).header.prev_code_len = uVar18;
          (s->arena).header.repeat_code_len = uVar20;
          (s->arena).header.space = uVar34;
          uVar30 = uVar15;
        }
        else {
          uVar26 = (s->br).bit_pos_;
          if (0x1f < uVar26) {
            uVar28 = (s->br).val_;
            puVar9 = (uint *)(s->br).next_in;
            (s->br).val_ = uVar28 >> 0x20;
            (s->br).bit_pos_ = uVar26 ^ 0x20;
            (s->br).val_ = (ulong)*puVar9 << 0x20 | uVar28 >> 0x20;
            (s->br).avail_in = uVar27 - 4;
            (s->br).next_in = (uint8_t *)(puVar9 + 1);
          }
          uVar28 = (s->br).val_;
          uVar16 = (s->br).bit_pos_;
          uVar21 = (ulong)((uint)(uVar28 >> ((byte)uVar16 & 0x3f)) & 0x1f);
          uVar16 = (byte)s->trivial_literal_contexts[uVar21 + 0x11] + uVar16;
          (s->br).bit_pos_ = uVar16;
          uVar6 = *(ushort *)((long)s->trivial_literal_contexts + uVar21 * 4 + 0x46);
          if (uVar6 < 0x10) {
            if (uVar6 != 0) {
              uVar28 = (ulong)(uint)uVar6;
              puVar8[*(int *)((long)&s->arena + uVar28 * 4 + 0x650)] = (uint16_t)uVar15;
              *(uint32_t *)((long)&s->arena + uVar28 * 4 + 0x650) = uVar15;
              uVar34 = uVar34 - (0x8000U >> ((byte)uVar6 & 0x1f));
              psVar2 = (short *)((long)&s->arena + uVar28 * 2 + 0x6e2);
              *psVar2 = *psVar2 + 1;
              uVar18 = (uint32_t)uVar6;
            }
            uVar25 = 0;
            uVar30 = uVar15 + 1;
          }
          else {
            uVar21 = 0;
            if (uVar6 == 0x10) {
              uVar21 = (ulong)uVar18;
            }
            uVar26 = uVar6 == 0x10 ^ 3;
            uVar29 = (uint)(uVar28 >> ((byte)uVar16 & 0x3f)) & kBitMask[uVar26];
            (s->br).bit_pos_ = uVar16 + uVar26;
            uVar19 = (uint32_t)uVar21;
            uVar16 = uVar25;
            if (uVar20 != uVar19) {
              uVar16 = 0;
            }
            uVar26 = uVar16 - 2 << (sbyte)uVar26 | 3;
            if (uVar16 == 0) {
              uVar26 = 3;
            }
            uVar25 = uVar29 + uVar26;
            iVar12 = uVar25 - uVar16;
            uVar20 = uVar19;
            if (alphabet_size_limit < iVar12 + uVar15) {
              uVar34 = 0xfffff;
              uVar30 = alphabet_size_limit;
            }
            else {
              uVar30 = iVar12 + uVar15;
              if (uVar19 != 0) {
                iVar33 = (uVar29 + uVar26) - uVar16;
                uVar26 = *(uint *)((long)&s->arena + uVar21 * 4 + 0x650);
                do {
                  uVar29 = uVar15;
                  puVar8[(int)uVar26] = (uint16_t)uVar29;
                  iVar33 = iVar33 + -1;
                  uVar15 = uVar29 + 1;
                  uVar26 = uVar29;
                } while (iVar33 != 0);
                *(uint *)((long)&s->arena + uVar21 * 4 + 0x650) = uVar29;
                psVar2 = (short *)((long)&s->arena + uVar21 * 2 + 0x6e2);
                *psVar2 = *psVar2 + (short)iVar12;
                uVar34 = uVar34 - (iVar12 << (0xfU - (char)uVar21 & 0x1f));
                uVar30 = uVar29 + 1;
              }
            }
          }
        }
        uVar15 = uVar30;
      } while (3 < uVar27);
      bVar36 = true;
    }
LAB_00103919:
    if (bVar36) {
      uVar26 = (s->arena).header.symbol;
      BVar11 = BROTLI_DECODER_SUCCESS;
      if (uVar26 < alphabet_size_limit) {
        uVar15 = (s->arena).header.space;
        bVar36 = false;
        do {
          if (uVar15 == 0) break;
          if (bVar36) {
            sVar32 = (s->br).avail_in;
            if (sVar32 != 0) {
              uVar27 = (s->br).val_;
              pbVar7 = (s->br).next_in;
              (s->br).val_ = uVar27 >> 8;
              (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar27 >> 8;
              puVar1 = &(s->br).bit_pos_;
              *puVar1 = *puVar1 - 8;
              (s->br).avail_in = sVar32 - 1;
              (s->br).next_in = pbVar7 + 1;
              goto LAB_00103999;
            }
            bVar23 = true;
            bVar36 = true;
          }
          else {
LAB_00103999:
            uVar25 = (s->br).bit_pos_;
            uVar29 = 0;
            if (uVar25 != 0x40) {
              uVar29 = (uint)(br_00->val_ >> ((byte)uVar25 & 0x3f));
            }
            bVar3 = (byte)s->trivial_literal_contexts[(ulong)(uVar29 & 0x1f) + 0x11];
            bVar36 = true;
            bVar23 = false;
            if ((uint)bVar3 <= 0x40 - uVar25) {
              uVar6 = *(ushort *)
                       ((long)s->trivial_literal_contexts + (ulong)(uVar29 & 0x1f) * 4 + 0x46);
              if (uVar6 < 0x10) {
                (s->br).bit_pos_ = uVar25 + bVar3;
                (s->arena).header.repeat = 0;
                uVar29 = (uint)uVar6;
                if (uVar29 != 0) {
                  uVar27 = (ulong)uVar29;
                  (s->arena).header.symbol_lists[*(int *)((long)&s->arena + uVar27 * 4 + 0x650)] =
                       (uint16_t)uVar26;
                  *(uint *)((long)&s->arena + uVar27 * 4 + 0x650) = uVar26;
                  (s->arena).header.prev_code_len = uVar29;
                  uVar15 = uVar15 - (0x8000U >> ((byte)uVar6 & 0x1f));
                  (s->arena).header.space = uVar15;
                  psVar2 = (short *)((long)&s->arena + uVar27 * 2 + 0x6e2);
                  *psVar2 = *psVar2 + 1;
                }
                uVar30 = uVar26 + 1;
                (s->arena).header.symbol = uVar30;
              }
              else {
                uVar30 = ((uint)uVar6 + (uint)bVar3) - 0xe;
                if (0x40 - uVar25 < uVar30) goto LAB_00103a69;
                uVar29 = uVar29 >> (bVar3 & 0x1f) & kBitMask[uVar6 - 0xe];
                (s->br).bit_pos_ = uVar30 + uVar25;
                if (uVar6 == 0x10) {
                  uVar25 = (s->arena).header.prev_code_len;
                  sVar13 = 2;
                }
                else {
                  uVar25 = 0;
                  sVar13 = 3;
                }
                if ((s->arena).header.repeat_code_len != uVar25) {
                  (s->arena).header.repeat = 0;
                  (s->arena).header.repeat_code_len = uVar25;
                }
                uVar25 = (s->arena).header.repeat;
                if (uVar25 != 0) {
                  (s->arena).header.repeat = uVar25 - 2 << sVar13;
                }
                puVar8 = (s->arena).header.symbol_lists;
                uVar34 = (s->arena).header.repeat;
                uVar20 = uVar29 + uVar34 + 3;
                (s->arena).header.repeat = uVar20;
                iVar12 = uVar20 - uVar25;
                uVar30 = iVar12 + uVar26;
                if (alphabet_size_limit < uVar30) {
                  (s->arena).header.symbol = alphabet_size_limit;
                  (s->arena).header.space = 0xfffff;
                  uVar15 = 0xfffff;
                  uVar30 = alphabet_size_limit;
                }
                else {
                  uVar24 = (s->arena).header.repeat_code_len;
                  uVar27 = (ulong)uVar24;
                  if (uVar27 == 0) {
                    (s->arena).header.symbol = uVar30;
                  }
                  else {
                    iVar33 = ((uVar34 + uVar29) - uVar25) + 3;
                    uVar29 = *(uint *)((long)&s->arena + uVar27 * 4 + 0x650);
                    do {
                      uVar31 = uVar26;
                      puVar8[(int)uVar29] = (uint16_t)uVar31;
                      uVar30 = uVar31 + 1;
                      iVar33 = iVar33 + -1;
                      uVar26 = uVar30;
                      uVar29 = uVar31;
                    } while (iVar33 != 0);
                    (s->arena).header.symbol = uVar30;
                    *(uint *)((long)&s->arena + uVar27 * 4 + 0x650) = uVar31;
                    uVar15 = uVar15 - (iVar12 << (0xfU - (char)uVar24 & 0x1f));
                    (s->arena).header.space = uVar15;
                    psVar2 = (short *)((long)&s->arena + uVar27 * 2 + 0x6e2);
                    *psVar2 = *psVar2 + (short)iVar12;
                  }
                }
              }
              bVar23 = false;
              bVar36 = false;
              uVar26 = uVar30;
            }
          }
LAB_00103a69:
          if (bVar23) {
            BVar11 = BROTLI_DECODER_NEEDS_MORE_INPUT;
            break;
          }
        } while (uVar26 < alphabet_size_limit);
      }
    }
    if (BVar11 != BROTLI_DECODER_SUCCESS) {
      return BVar11;
    }
    if ((s->arena).header.space != 0) {
      return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
    }
    uVar15 = BrotliBuildHuffmanTable
                       (table,8,(s->arena).header.symbol_lists,(s->arena).header.code_length_histo);
    goto LAB_00103643;
  default:
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  goto LAB_00103589;
LAB_00103525:
  do {
    if (uVar27 == uVar29) {
      BVar11 = BROTLI_DECODER_SUCCESS;
      break;
    }
    sVar5 = *(short *)((long)&s->arena + uVar27 * 2 + 0xb0);
    uVar27 = uVar27 + 1;
    uVar30 = uVar26;
    if (sVar5 == *(short *)((long)&s->arena + (uVar27 & 0xffffffff) * 2 + 0xb0)) {
      bVar36 = false;
      BVar10 = BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
    }
    else {
      do {
        bVar36 = uVar29 < uVar30;
        BVar10 = BVar11;
        if (uVar29 < uVar30) break;
        uVar28 = (ulong)uVar30;
        uVar30 = uVar30 + 1;
        BVar10 = BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
      } while (sVar5 != *(short *)((long)&s->arena + uVar28 * 2 + 0xb0));
    }
    BVar11 = BVar10;
    uVar26 = uVar26 + 1;
  } while (bVar36);
LAB_00103589:
  if (BVar11 != BROTLI_DECODER_SUCCESS) {
    return BVar11;
  }
LAB_00103592:
  if ((s->arena).header.symbol == 3) {
    uVar26 = (s->br).bit_pos_;
    bVar36 = uVar26 == 0x40;
    if (bVar36) {
      sVar32 = (s->br).avail_in;
      if (sVar32 != 0) {
        uVar27 = (s->br).val_;
        pbVar7 = (s->br).next_in;
        (s->br).val_ = uVar27 >> 8;
        (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar27 >> 8;
        uVar26 = 0x38;
        (s->br).bit_pos_ = 0x38;
        (s->br).avail_in = sVar32 - 1;
        (s->br).next_in = pbVar7 + 1;
        bVar36 = false;
        goto LAB_001035ef;
      }
      uVar29 = 0;
    }
    else {
LAB_001035ef:
      uVar29 = (uint)(((s->br).val_ >> ((ulong)uVar26 & 0x3f) & 1) != 0);
      (s->br).bit_pos_ = uVar26 + 1;
    }
    if (bVar36) {
      (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    (s->arena).header.symbol = uVar29 + 3;
  }
  uVar15 = BrotliBuildSimpleHuffmanTable
                     (table,8,(s->arena).header.symbols_lists_array,(s->arena).header.symbol);
LAB_00103643:
  if (opt_table_size != (uint32_t *)0x0) {
    *opt_table_size = uVar15;
  }
  BVar11 = BROTLI_DECODER_SUCCESS;
  BVar14 = BROTLI_STATE_HUFFMAN_NONE;
LAB_00103656:
  (s->arena).header.substate_huffman = BVar14;
  return BVar11;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(uint32_t alphabet_size_max,
                                              uint32_t alphabet_size_limit,
                                              HuffmanCode* table,
                                              uint32_t* opt_table_size,
                                              BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliMetablockHeaderArena* h = &s->arena.header;
  /* State machine. */
  for (;;) {
    switch (h->substate_huffman) {
      case BROTLI_STATE_HUFFMAN_NONE:
        if (!BrotliSafeReadBits(br, 2, &h->sub_loop_counter)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        BROTLI_LOG_UINT(h->sub_loop_counter);
        /* The value is used as follows:
           1 for simple code;
           0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
        if (h->sub_loop_counter != 1) {
          h->space = 32;
          h->repeat = 0;  /* num_codes */
          memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo[0]) *
              (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
          memset(&h->code_length_code_lengths[0], 0,
              sizeof(h->code_length_code_lengths));
          h->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
          continue;
        }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
        /* Read symbols, codes & code lengths directly. */
        if (!BrotliSafeReadBits(br, 2, &h->symbol)) {  /* num_symbols */
          h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        h->sub_loop_counter = 0;
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
        BrotliDecoderErrorCode result =
            ReadSimpleHuffmanSymbols(alphabet_size_max, alphabet_size_limit, s);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
      }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
        uint32_t table_size;
        if (h->symbol == 3) {
          uint32_t bits;
          if (!BrotliSafeReadBits(br, 1, &bits)) {
            h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          h->symbol += bits;
        }
        BROTLI_LOG_UINT(h->symbol);
        table_size = BrotliBuildSimpleHuffmanTable(
            table, HUFFMAN_TABLE_BITS, h->symbols_lists_array, h->symbol);
        if (opt_table_size) {
          *opt_table_size = table_size;
        }
        h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
        return BROTLI_DECODER_SUCCESS;
      }

      /* Decode Huffman-coded code lengths. */
      case BROTLI_STATE_HUFFMAN_COMPLEX: {
        uint32_t i;
        BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
        BrotliBuildCodeLengthsHuffmanTable(h->table,
                                           h->code_length_code_lengths,
                                           h->code_length_histo);
        memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo));
        for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
          h->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
          h->symbol_lists[h->next_symbol[i]] = 0xFFFF;
        }

        h->symbol = 0;
        h->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
        h->repeat = 0;
        h->repeat_code_len = 0;
        h->space = 32768;
        h->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
      }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
        uint32_t table_size;
        BrotliDecoderErrorCode result = ReadSymbolCodeLengths(
            alphabet_size_limit, s);
        if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
          result = SafeReadSymbolCodeLengths(alphabet_size_limit, s);
        }
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }

        if (h->space != 0) {
          BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", (int)h->space));
          return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
        }
        table_size = BrotliBuildHuffmanTable(
            table, HUFFMAN_TABLE_BITS, h->symbol_lists, h->code_length_histo);
        if (opt_table_size) {
          *opt_table_size = table_size;
        }
        h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
        return BROTLI_DECODER_SUCCESS;
      }

      default:
        return
            BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
    }
  }
}